

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fio.c
# Opt level: O2

intptr_t fio_listen(fio_listen_args args)

{
  size_t sVar1;
  size_t sVar2;
  int64_t iVar3;
  int *piVar4;
  intptr_t iVar5;
  undefined8 *arg;
  uintptr_t uVar6;
  code *pcVar7;
  void *__dest;
  char *format;
  char *tmp;
  
  if (((args.on_open == (_func_void_intptr_t_void_ptr *)0x0) &&
      ((args.tls == (void *)0x0 || (uVar6 = fio_tls_alpn_count(args.tls), uVar6 == 0)))) ||
     (args.address == (char *)0x0 && args.port == (char *)0x0)) {
LAB_001095b7:
    piVar4 = __errno_location();
    *piVar4 = 0x16;
  }
  else {
    if (args.address == (char *)0x0) {
      sVar1 = 0;
    }
    else {
      sVar1 = strlen(args.address);
    }
    if (args.port == (char *)0x0) {
      args.port = (char *)0x0;
      sVar2 = 0;
    }
    else {
      sVar2 = strlen(args.port);
      tmp = args.port;
      iVar3 = fio_atol(&tmp);
      if (iVar3 == 0) {
        args.port = (char *)0x0;
        sVar2 = 0;
      }
      if (*tmp != '\0') goto LAB_001095b7;
    }
    iVar5 = fio_socket(args.address,args.port,'\x01');
    if (iVar5 != -1) {
      arg = (undefined8 *)malloc(sVar1 + sVar2 + (ulong)(sVar1 + sVar2 != 0) * 2 + 0x80);
      if (arg == (undefined8 *)0x0) {
        if (0 < FIO_LOG_LEVEL) {
          FIO_LOG2STDERR(
                        "FATAL: memory allocation error /workspace/llm4binary/github/license_all_cmakelists_1510/spujadas[P]rshutdown/facil/lib/facil/fio.c:4594"
                        );
        }
        kill(0,2);
        piVar4 = __errno_location();
        exit(*piVar4);
      }
      if (args.tls == (void *)0x0) {
        pcVar7 = fio_listen_on_data;
      }
      else {
        fio_tls_dup(args.tls);
        uVar6 = fio_tls_alpn_count(args.tls);
        pcVar7 = fio_listen_on_data_tls_alpn;
        if (uVar6 == 0) {
          pcVar7 = fio_listen_on_data_tls;
        }
      }
      __dest = (void *)((long)arg + sVar1 + 0x81);
      *arg = pcVar7;
      arg[1] = 0;
      arg[2] = 0;
      arg[3] = fio_listen_on_close;
      arg[4] = mock_ping_eternal;
      arg[5] = 0;
      arg[6] = iVar5;
      arg[7] = args.udata;
      arg[8] = args.on_open;
      arg[9] = args.on_start;
      arg[10] = args.on_finish;
      arg[0xb] = __dest;
      arg[0xc] = arg + 0x10;
      arg[0xd] = sVar2;
      arg[0xe] = sVar1;
      arg[0xf] = args.tls;
      if (sVar1 != 0) {
        memcpy(arg + 0x10,args.address,sVar1 + 1);
      }
      if (sVar2 != 0) {
        memcpy(__dest,args.port,sVar2 + 1);
      }
      if ((fio_data == (fio_data_s *)0x0) || (fio_data->active == '\0')) {
        fio_state_callback_add(FIO_CALL_ON_START,fio_listen_on_startup,arg);
        fio_state_callback_add(FIO_CALL_ON_SHUTDOWN,fio_listen_cleanup_task,arg);
      }
      else {
        fio_attach__internal((void *)arg[6],arg);
      }
      if (args.port == (char *)0x0) {
        if (FIO_LOG_LEVEL < 4) {
          return iVar5;
        }
        format = "INFO: Listening on Unix Socket at %s";
      }
      else {
        if (FIO_LOG_LEVEL < 4) {
          return iVar5;
        }
        format = "INFO: Listening on port %s";
        args.address = args.port;
      }
      FIO_LOG2STDERR(format,args.address);
      return iVar5;
    }
  }
  if (args.on_finish != (_func_void_intptr_t_void_ptr *)0x0) {
    (*args.on_finish)(-1,args.udata);
  }
  return -1;
}

Assistant:

intptr_t fio_listen FIO_IGNORE_MACRO(struct fio_listen_args args) {
  // ...
  if ((!args.on_open && (!args.tls || !fio_tls_alpn_count(args.tls))) ||
      (!args.address && !args.port)) {
    errno = EINVAL;
    goto error;
  }

  size_t addr_len = 0;
  size_t port_len = 0;
  if (args.address)
    addr_len = strlen(args.address);
  if (args.port) {
    port_len = strlen(args.port);
    char *tmp = (char *)args.port;
    if (!fio_atol(&tmp)) {
      port_len = 0;
      args.port = NULL;
    }
    if (*tmp) {
      /* port format was invalid, should be only numerals */
      errno = EINVAL;
      goto error;
    }
  }
  const intptr_t uuid = fio_socket(args.address, args.port, 1);
  if (uuid == -1)
    goto error;

  fio_listen_protocol_s *pr = malloc(sizeof(*pr) + addr_len + port_len +
                                     ((addr_len + port_len) ? 2 : 0));
  FIO_ASSERT_ALLOC(pr);

  if (args.tls)
    fio_tls_dup(args.tls);

  *pr = (fio_listen_protocol_s){
      .pr =
          {
              .on_close = fio_listen_on_close,
              .ping = mock_ping_eternal,
              .on_data = (args.tls ? (fio_tls_alpn_count(args.tls)
                                          ? fio_listen_on_data_tls_alpn
                                          : fio_listen_on_data_tls)
                                   : fio_listen_on_data),
          },
      .uuid = uuid,
      .udata = args.udata,
      .on_open = args.on_open,
      .on_start = args.on_start,
      .on_finish = args.on_finish,
      .tls = args.tls,
      .addr_len = addr_len,
      .port_len = port_len,
      .addr = (char *)(pr + 1),
      .port = ((char *)(pr + 1) + addr_len + 1),
  };

  if (addr_len)
    memcpy(pr->addr, args.address, addr_len + 1);
  if (port_len)
    memcpy(pr->port, args.port, port_len + 1);

  if (fio_is_running()) {
    fio_attach(pr->uuid, &pr->pr);
  } else {
    fio_state_callback_add(FIO_CALL_ON_START, fio_listen_on_startup, pr);
    fio_state_callback_add(FIO_CALL_ON_SHUTDOWN, fio_listen_cleanup_task, pr);
  }

  if (args.port)
    FIO_LOG_INFO("Listening on port %s", args.port);
  else
    FIO_LOG_INFO("Listening on Unix Socket at %s", args.address);

  return uuid;
error:
  if (args.on_finish) {
    args.on_finish(-1, args.udata);
  }
  return -1;
}